

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publisher.cc
# Opt level: O1

int Publisher::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  undefined4 in_register_0000003c;
  undefined8 *puVar7;
  stringstream ss;
  string asStack_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  iVar2 = nn_socket(1,0x20);
  if (iVar2 < 0) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"nn_socket: ",0xb);
    iVar2 = nn_errno();
    pcVar4 = nn_strerror(iVar2);
    std::operator<<(local_198,pcVar4);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_1c8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar7 = *(undefined8 **)CONCAT44(in_register_0000003c,__fd);
  puVar1 = (undefined8 *)((undefined8 *)CONCAT44(in_register_0000003c,__fd))[1];
  while( true ) {
    if (puVar7 == puVar1) {
      return iVar2;
    }
    iVar3 = nn_bind(iVar2,(char *)*puVar7);
    if (iVar3 < 0) break;
    puVar7 = puVar7 + 4;
  }
  nn_close(iVar2);
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"nn_bind: ",9);
  iVar2 = nn_errno();
  pcVar4 = nn_strerror(iVar2);
  std::operator<<(local_198,pcVar4);
  std::__ostream_insert<char,std::char_traits<char>>(local_198," (",2);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(local_198,(char *)*puVar7,puVar7[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar6,asStack_1c8);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int Publisher::bind(const std::vector<std::string>& endpoints) {
  auto fd = nn_socket(AF_SP, NN_PUB);
  if (fd < 0) {
    std::stringstream ss;
    ss << "nn_socket: " << nn_strerror(nn_errno());
    throw std::runtime_error(ss.str());
  }

  for (const auto& endpoint : endpoints) {
    auto rv = nn_bind(fd, endpoint.c_str());
    if (rv < 0) {
      nn_close(fd);
      std::stringstream ss;
      ss << "nn_bind: " << nn_strerror(nn_errno());
      ss << " (" << endpoint << ")";
      throw std::runtime_error(ss.str());
    }
  }

  return fd;
}